

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O2

int Parser_isValidXmlName(char *name)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (name == (char *)0x0) {
    __assert_fail("name != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                  ,0xa95,"int Parser_isValidXmlName(const char *)");
  }
  sVar2 = strlen(name);
  iVar1 = Parser_isNameChar((int)*name,0);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    uVar3 = 1;
    do {
      if (sVar2 <= uVar3) {
        return 1;
      }
      iVar1 = Parser_isNameChar((int)name[uVar3],1);
      uVar3 = uVar3 + 1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Parser_isValidXmlName(const DOMString name)
{
	const char *pstr = NULL;
	size_t i = (size_t)0;
	size_t nameLen = (size_t)0;

	assert(name != NULL);

	nameLen = strlen(name);
	pstr = name;
	if (Parser_isNameChar((int)*pstr, 0)) {
		for (i = (size_t)1; i < nameLen; ++i) {
			if (Parser_isNameChar((int)*(pstr + i), 1) == 0) {
				/* illegal char */
				return 0;
			}
		}
	}

	return 1;
}